

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec3.h
# Opt level: O2

long vec3::random(void)

{
  double *in_RDI;
  double in_XMM0_Qa;
  double dVar1;
  double dVar2;
  double dVar3;
  double in_XMM1_Qa;
  double dVar4;
  
  dVar4 = in_XMM1_Qa - in_XMM0_Qa;
  dVar1 = random_double();
  dVar2 = random_double();
  dVar3 = random_double();
  *in_RDI = in_XMM0_Qa + dVar1 * dVar4;
  in_RDI[1] = in_XMM0_Qa + dVar2 * dVar4;
  in_RDI[2] = dVar3 * dVar4 + in_XMM0_Qa;
  return (long)in_RDI;
}

Assistant:

static vec3 random(double min, double max) {
        return vec3(random_double(min,max), random_double(min,max), random_double(min,max));
    }